

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btConvexConvexAlgorithm.cpp
# Opt level: O2

btScalar __thiscall
btConvexConvexAlgorithm::calculateTimeOfImpact
          (btConvexConvexAlgorithm *this,btCollisionObject *col0,btCollisionObject *col1,
          btDispatcherInfo *dispatchInfo,btManifoldResult *resultOut)

{
  btCollisionShape *pbVar1;
  float fVar2;
  bool bVar3;
  btScalar bVar4;
  btScalar bVar5;
  btGjkConvexCast ccd1;
  btSphereShape sphere1;
  CastResult result;
  btVoronoiSimplexSolver voronoiSimplex;
  float local_2d4;
  btGjkConvexCast local_2c0;
  btSphereShape local_2a0;
  CastResult local_258;
  btVoronoiSimplexSolver local_198;
  
  local_198._0_16_ =
       operator-(&(col0->m_interpolationWorldTransform).m_origin,&(col0->m_worldTransform).m_origin)
  ;
  bVar4 = btVector3::length2((btVector3 *)&local_198);
  local_198._0_16_ =
       operator-(&(col1->m_interpolationWorldTransform).m_origin,&(col1->m_worldTransform).m_origin)
  ;
  bVar5 = btVector3::length2((btVector3 *)&local_198);
  if (((bVar4 < col0->m_ccdMotionThreshold * col0->m_ccdMotionThreshold) &&
      (bVar5 < col1->m_ccdMotionThreshold * col1->m_ccdMotionThreshold)) || (disableCcd != false)) {
    local_2d4 = 1.0;
  }
  else {
    pbVar1 = col0->m_collisionShape;
    btSphereShape::btSphereShape(&local_2a0,col1->m_ccdSweptSphereRadius);
    local_258._vptr_CastResult = (_func_int **)&PTR_DebugDraw_001ecc78;
    local_258.m_fraction = 1e+18;
    local_258.m_debugDrawer = (btIDebugDraw *)0x0;
    local_258.m_allowedPenetration = 0.0;
    local_198.m_equalVertexThreshold = 0.0001;
    local_198.m_cachedBC.m_usedVertices._0_1_ = 0;
    btGjkConvexCast::btGjkConvexCast
              (&local_2c0,(btConvexShape *)pbVar1,(btConvexShape *)&local_2a0,&local_198);
    bVar3 = btGjkConvexCast::calcTimeOfImpact
                      (&local_2c0,&col0->m_worldTransform,&col0->m_interpolationWorldTransform,
                       &col1->m_worldTransform,&col1->m_interpolationWorldTransform,&local_258);
    if (bVar3) {
      if (local_258.m_fraction < col0->m_hitFraction) {
        col0->m_hitFraction = local_258.m_fraction;
      }
      if (local_258.m_fraction < col1->m_hitFraction) {
        col1->m_hitFraction = local_258.m_fraction;
      }
      local_2d4 = 1.0;
      fVar2 = local_258.m_fraction;
      if (1.0 <= local_258.m_fraction) {
        fVar2 = local_2d4;
      }
    }
    else {
      fVar2 = 1.0;
    }
    local_2d4 = fVar2;
    btConvexCast::~btConvexCast(&local_2c0.super_btConvexCast);
    btConvexShape::~btConvexShape((btConvexShape *)&local_2a0);
    pbVar1 = col1->m_collisionShape;
    btSphereShape::btSphereShape(&local_2a0,col0->m_ccdSweptSphereRadius);
    local_258._vptr_CastResult = (_func_int **)&PTR_DebugDraw_001ecc78;
    local_258.m_fraction = 1e+18;
    local_258.m_debugDrawer = (btIDebugDraw *)0x0;
    local_258.m_allowedPenetration = 0.0;
    local_198.m_equalVertexThreshold = 0.0001;
    local_198.m_cachedBC.m_usedVertices._0_1_ = 0;
    btGjkConvexCast::btGjkConvexCast
              (&local_2c0,(btConvexShape *)&local_2a0,(btConvexShape *)pbVar1,&local_198);
    bVar3 = btGjkConvexCast::calcTimeOfImpact
                      (&local_2c0,&col0->m_worldTransform,&col0->m_interpolationWorldTransform,
                       &col1->m_worldTransform,&col1->m_interpolationWorldTransform,&local_258);
    if (bVar3) {
      if (local_258.m_fraction < col0->m_hitFraction) {
        col0->m_hitFraction = local_258.m_fraction;
      }
      if (local_258.m_fraction < col1->m_hitFraction) {
        col1->m_hitFraction = local_258.m_fraction;
      }
      if (local_258.m_fraction < local_2d4) {
        local_2d4 = local_258.m_fraction;
      }
    }
    btConvexCast::~btConvexCast(&local_2c0.super_btConvexCast);
    btConvexShape::~btConvexShape((btConvexShape *)&local_2a0);
  }
  return local_2d4;
}

Assistant:

btScalar	btConvexConvexAlgorithm::calculateTimeOfImpact(btCollisionObject* col0,btCollisionObject* col1,const btDispatcherInfo& dispatchInfo,btManifoldResult* resultOut)
{
	(void)resultOut;
	(void)dispatchInfo;
	///Rather then checking ALL pairs, only calculate TOI when motion exceeds threshold
    
	///Linear motion for one of objects needs to exceed m_ccdSquareMotionThreshold
	///col0->m_worldTransform,
	btScalar resultFraction = btScalar(1.);


	btScalar squareMot0 = (col0->getInterpolationWorldTransform().getOrigin() - col0->getWorldTransform().getOrigin()).length2();
	btScalar squareMot1 = (col1->getInterpolationWorldTransform().getOrigin() - col1->getWorldTransform().getOrigin()).length2();
    
	if (squareMot0 < col0->getCcdSquareMotionThreshold() &&
		squareMot1 < col1->getCcdSquareMotionThreshold())
		return resultFraction;

	if (disableCcd)
		return btScalar(1.);


	//An adhoc way of testing the Continuous Collision Detection algorithms
	//One object is approximated as a sphere, to simplify things
	//Starting in penetration should report no time of impact
	//For proper CCD, better accuracy and handling of 'allowed' penetration should be added
	//also the mainloop of the physics should have a kind of toi queue (something like Brian Mirtich's application of Timewarp for Rigidbodies)

		
	/// Convex0 against sphere for Convex1
	{
		btConvexShape* convex0 = static_cast<btConvexShape*>(col0->getCollisionShape());

		btSphereShape	sphere1(col1->getCcdSweptSphereRadius()); //todo: allow non-zero sphere sizes, for better approximation
		btConvexCast::CastResult result;
		btVoronoiSimplexSolver voronoiSimplex;
		//SubsimplexConvexCast ccd0(&sphere,min0,&voronoiSimplex);
		///Simplification, one object is simplified as a sphere
		btGjkConvexCast ccd1( convex0 ,&sphere1,&voronoiSimplex);
		//ContinuousConvexCollision ccd(min0,min1,&voronoiSimplex,0);
		if (ccd1.calcTimeOfImpact(col0->getWorldTransform(),col0->getInterpolationWorldTransform(),
			col1->getWorldTransform(),col1->getInterpolationWorldTransform(),result))
		{
		
			//store result.m_fraction in both bodies
		
			if (col0->getHitFraction()> result.m_fraction)
				col0->setHitFraction( result.m_fraction );

			if (col1->getHitFraction() > result.m_fraction)
				col1->setHitFraction( result.m_fraction);

			if (resultFraction > result.m_fraction)
				resultFraction = result.m_fraction;

		}
		
		


	}

	/// Sphere (for convex0) against Convex1
	{
		btConvexShape* convex1 = static_cast<btConvexShape*>(col1->getCollisionShape());

		btSphereShape	sphere0(col0->getCcdSweptSphereRadius()); //todo: allow non-zero sphere sizes, for better approximation
		btConvexCast::CastResult result;
		btVoronoiSimplexSolver voronoiSimplex;
		//SubsimplexConvexCast ccd0(&sphere,min0,&voronoiSimplex);
		///Simplification, one object is simplified as a sphere
		btGjkConvexCast ccd1(&sphere0,convex1,&voronoiSimplex);
		//ContinuousConvexCollision ccd(min0,min1,&voronoiSimplex,0);
		if (ccd1.calcTimeOfImpact(col0->getWorldTransform(),col0->getInterpolationWorldTransform(),
			col1->getWorldTransform(),col1->getInterpolationWorldTransform(),result))
		{
		
			//store result.m_fraction in both bodies
		
			if (col0->getHitFraction()	> result.m_fraction)
				col0->setHitFraction( result.m_fraction);

			if (col1->getHitFraction() > result.m_fraction)
				col1->setHitFraction( result.m_fraction);

			if (resultFraction > result.m_fraction)
				resultFraction = result.m_fraction;

		}
	}
	
	return resultFraction;

}